

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightLeSample> * __thiscall
pbrt::UniformInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,UniformInfiniteLight *this,
          Point2f u1,Point2f u2,SampledWavelengths *lambda,Float time)

{
  float fVar1;
  Float a;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar8;
  undefined1 auVar2 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  float fVar10;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar11 [64];
  undefined1 auVar14 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [16];
  SampledSpectrum SVar16;
  Vector3f VVar17;
  Vector3f VVar18;
  Point3<float> PVar19;
  Frame wFrame;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  Tuple2<pbrt::Point2,_float> local_110;
  Tuple2<pbrt::Point2,_float> local_108;
  SampledSpectrum local_100;
  Frame local_ec;
  LightLeSample local_c8;
  Vector3f v;
  undefined1 auVar9 [56];
  
  local_c8.L.values.values[3] = local_c8.L.values.values[1];
  auVar11._8_56_ = in_register_00001248;
  auVar11._0_8_ = u2.super_Tuple2<pbrt::Point2,_float>;
  auVar3._8_56_ = in_register_00001208;
  auVar3._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  local_108 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3._0_16_);
  local_110 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar11._0_16_);
  VVar17 = SampleUniformSphere((Point2f *)&local_108);
  fVar10 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar4._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = in_register_00001208;
  VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar4._0_8_ ^ 0x8000000080000000;
  VVar18.super_Tuple3<pbrt::Vector3,_float>.z = -fVar10;
  Frame::FromZ(&local_ec,VVar18);
  v.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SampleUniformDiskConcentric((Point2f *)&local_110);
  fVar1 = this->sceneRadius;
  v.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  uVar8 = extraout_XMM0_Qb;
  VVar18 = Frame::FromLocal(&local_ec,v);
  auVar2._0_4_ = fVar1 * VVar18.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar2._4_4_ = fVar1 * VVar18.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar2._8_4_ = fVar1 * (float)uVar8;
  auVar2._12_4_ = fVar1 * (float)((ulong)uVar8 >> 0x20);
  auVar9 = ZEXT856(auVar2._8_8_);
  uVar8 = vmovlps_avx(auVar2);
  local_c8.L.values.values[2] = fVar1 * VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
  local_c8.L.values.values[0] = (float)(int)uVar8;
  local_c8.L.values.values[1] = (float)(int)((ulong)uVar8 >> 0x20);
  PVar19 = Point3<float>::operator+(&this->sceneCenter,(Vector3<float> *)&local_c8);
  auVar5._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar9;
  fVar1 = this->sceneRadius;
  local_138 = VVar17.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_134 = VVar17.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_130 = in_register_00001208._0_4_;
  fStack_12c = in_register_00001208._4_4_;
  auVar15._0_4_ = fVar1 * local_138;
  auVar15._4_4_ = fVar1 * fStack_134;
  auVar15._8_4_ = fVar1 * fStack_130;
  auVar15._12_4_ = fVar1 * fStack_12c;
  auVar2 = vsubps_avx(auVar5._0_16_,auVar15);
  auVar14 = (undefined1  [56])0x0;
  a = this->scale;
  auVar9 = (undefined1  [56])0x0;
  SVar16 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar12._0_8_ = SVar16.values.values._8_8_;
  auVar12._8_56_ = auVar14;
  auVar6._0_8_ = SVar16.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  local_100.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar12._0_16_);
  auVar9 = (undefined1  [56])0x0;
  SVar16 = SampledSpectrum::operator*(&local_100,a);
  auVar13._0_8_ = SVar16.values.values._8_8_;
  auVar13._8_56_ = auVar14;
  auVar7._0_8_ = SVar16.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  local_c8.L.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar13._0_16_);
  local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar2);
  local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar4._0_16_);
  local_c8.ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           )0;
  local_c8.intr.set = false;
  local_c8.pdfDir = 0.07957747;
  local_c8.ray.o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar19.super_Tuple3<pbrt::Point3,_float>.z - fVar1 * fVar10;
  local_c8.ray.d.super_Tuple3<pbrt::Vector3,_float>.z = fVar10;
  local_c8.ray.time = time;
  local_c8.pdfPos = 1.0 / (fVar1 * fVar1 * 3.1415927);
  pstd::optional<pbrt::LightLeSample>::optional(__return_storage_ptr__,&local_c8);
  pstd::optional<pbrt::Interaction>::~optional(&local_c8.intr);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> UniformInfiniteLight::SampleLe(Point2f u1, Point2f u2,
                                                             SampledWavelengths &lambda,
                                                             Float time) const {
    // Sample direction for uniform infinite light ray
    Vector3f w = SampleUniformSphere(u1);

    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute probabilities for uniform infinite light
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
    Float pdfDir = UniformSpherePDF();

    return LightLeSample(scale * Lemit.Sample(lambda), ray, pdfPos, pdfDir);
}